

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

void xmlBufGetEntityRefContent(xmlBufPtr buf,xmlNode *ref)

{
  xmlEntityPtr tree;
  
  tree = (xmlEntityPtr)ref->children;
  if ((tree == (xmlEntityPtr)0x0) &&
     (tree = xmlGetDocEntity(ref->doc,ref->name), tree == (xmlEntityPtr)0x0)) {
    return;
  }
  if (tree->etype != XML_INTERNAL_PREDEFINED_ENTITY) {
    if ((tree->flags & 8U) == 0) {
      tree->flags = tree->flags | 8;
      xmlBufGetChildContent(buf,(xmlNode *)tree);
      *(byte *)&tree->flags = (byte)tree->flags & 0xf7;
    }
    return;
  }
  xmlBufCat(buf,tree->content);
  return;
}

Assistant:

static void
xmlBufGetEntityRefContent(xmlBufPtr buf, const xmlNode *ref) {
    xmlEntityPtr ent;

    if (ref->children != NULL) {
        ent = (xmlEntityPtr) ref->children;
    } else {
        /* lookup entity declaration */
        ent = xmlGetDocEntity(ref->doc, ref->name);
        if (ent == NULL)
            return;
    }

    /*
     * The parser should always expand predefined entities but it's
     * possible to create references to predefined entities using
     * the tree API.
     */
    if (ent->etype == XML_INTERNAL_PREDEFINED_ENTITY) {
        xmlBufCat(buf, ent->content);
        return;
    }

    if (ent->flags & XML_ENT_EXPANDING)
        return;

    ent->flags |= XML_ENT_EXPANDING;
    xmlBufGetChildContent(buf, (xmlNodePtr) ent);
    ent->flags &= ~XML_ENT_EXPANDING;
}